

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.hpp
# Opt level: O3

string * __thiscall
duckdb::Exception::ConstructMessageRecursive<unsigned_long,std::__cxx11::string,char*>
          (string *__return_storage_ptr__,Exception *this,string *msg,
          vector<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_>
          *values,unsigned_long param,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *params,char *params_1)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *params_00;
  undefined1 local_88 [32];
  ExceptionFormatValue local_68;
  
  params_00 = params;
  ExceptionFormatValue::ExceptionFormatValue(&local_68,(int64_t)values);
  ::std::vector<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_>::
  emplace_back<duckdb::ExceptionFormatValue>
            ((vector<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_> *)
             msg,&local_68);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68.str_val._M_dataplus._M_p != &local_68.str_val.field_2) {
    operator_delete(local_68.str_val._M_dataplus._M_p);
  }
  local_88._0_8_ = (pointer)(local_88 + 0x10);
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)local_88,*(long *)param,*(long *)(param + 8) + *(long *)param);
  ConstructMessageRecursive<std::__cxx11::string,char*>
            (__return_storage_ptr__,this,msg,
             (vector<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_> *)
             local_88,params,(char *)params_00);
  if ((pointer)local_88._0_8_ != (pointer)(local_88 + 0x10)) {
    operator_delete((void *)local_88._0_8_);
  }
  return __return_storage_ptr__;
}

Assistant:

static string ConstructMessageRecursive(const string &msg, std::vector<ExceptionFormatValue> &values, T param,
	                                        ARGS... params) {
		values.push_back(ExceptionFormatValue::CreateFormatValue<T>(param));
		return ConstructMessageRecursive(msg, values, params...);
	}